

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O3

void __thiscall
bssl::anon_unknown_0::SSLTest_ECHKeyConsistency_Test::TestBody(SSLTest_ECHKeyConsistency_Test *this)

{
  bool bVar1;
  int iVar2;
  EVP_HPKE_KEM *pEVar3;
  char *in_R9;
  pointer *__ptr;
  allocator_type aVar4;
  initializer_list<unsigned_short> __l;
  initializer_list<unsigned_short> __l_00;
  initializer_list<unsigned_short> __l_01;
  UniquePtr<SSL_ECH_KEYS> keys;
  vector<unsigned_char,_std::allocator<unsigned_char>_> ech_config;
  ECHConfigParams wrong_kem;
  ECHConfigParams truncated;
  ECHConfigParams params;
  size_t public_key_len;
  ScopedEVP_HPKE_KEY wrong_key;
  ScopedEVP_HPKE_KEY key;
  uint8_t public_key [65];
  AssertHelper local_360;
  AssertHelper local_358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_350;
  undefined1 local_348 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_340;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_338;
  AssertHelper local_328;
  _Head_base<0UL,_ssl_ech_keys_st_*,_false> local_320;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_318;
  undefined1 local_2f8 [8];
  _Alloc_hider local_2f0;
  undefined1 local_2e8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  pointer local_2c0;
  pointer puStack_2b8;
  pointer local_2b0;
  size_t local_2a8;
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_2a0;
  pointer local_288;
  pointer puStack_280;
  pointer local_278;
  undefined1 local_270 [8];
  _Alloc_hider local_268;
  undefined1 local_260 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  pointer local_238;
  pointer puStack_230;
  pointer local_228;
  size_t local_220;
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_218;
  pointer local_200;
  pointer puStack_1f8;
  pointer local_1f0;
  undefined1 local_1e8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d0;
  EVP_HPKE_KEY *local_1c0;
  uint16_t local_1b8;
  pointer local_1b0;
  pointer puStack_1a8;
  pointer local_1a0;
  size_t local_198;
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_190;
  pointer local_178;
  pointer puStack_170;
  pointer local_168;
  size_t local_160;
  EVP_HPKE_KEY local_158;
  EVP_HPKE_KEY local_e8;
  uint8_t local_78 [72];
  
  local_320._M_head_impl = SSL_ECH_KEYS_new();
  local_270[0] = local_320._M_head_impl != (SSL_ECH_KEYS *)0x0;
  local_268._M_p = (pointer)0x0;
  if (local_320._M_head_impl == (SSL_ECH_KEYS *)0x0) {
    testing::Message::Message((Message *)local_2f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1e8,(internal *)local_270,(AssertionResult *)0x338821,"false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_e8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x7ce,(char *)CONCAT44(local_1e8._4_4_,local_1e8._0_4_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_e8,(Message *)local_2f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
    if ((undefined1 *)CONCAT44(local_1e8._4_4_,local_1e8._0_4_) != local_1e8 + 0x10) {
      operator_delete((undefined1 *)CONCAT44(local_1e8._4_4_,local_1e8._0_4_),local_1e8._16_8_ + 1);
    }
    if ((long *)CONCAT44(local_2f8._4_4_,local_2f8._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_2f8._4_4_,local_2f8._0_4_) + 8))();
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268._M_p !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_268,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_268._M_p);
    }
    goto LAB_001647a1;
  }
  EVP_HPKE_KEY_zero(&local_e8);
  pEVar3 = EVP_hpke_x25519_hkdf_sha256();
  iVar2 = EVP_HPKE_KEY_generate(&local_e8,pEVar3);
  local_270[0] = iVar2 != 0;
  local_268._M_p = (pointer)0x0;
  if (iVar2 == 0) {
    testing::Message::Message((Message *)local_2f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1e8,(internal *)local_270,
               (AssertionResult *)"EVP_HPKE_KEY_generate(key.get(), EVP_hpke_x25519_hkdf_sha256())",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_158,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,2000,(char *)CONCAT44(local_1e8._4_4_,local_1e8._0_4_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_158,(Message *)local_2f8);
LAB_001642d5:
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_158);
    if ((undefined1 *)CONCAT44(local_1e8._4_4_,local_1e8._0_4_) != local_1e8 + 0x10) {
      operator_delete((undefined1 *)CONCAT44(local_1e8._4_4_,local_1e8._0_4_),local_1e8._16_8_ + 1);
    }
    if ((long *)CONCAT44(local_2f8._4_4_,local_2f8._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_2f8._4_4_,local_2f8._0_4_) + 8))();
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268._M_p !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_268,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_268._M_p);
    }
  }
  else {
    iVar2 = EVP_HPKE_KEY_public_key(&local_e8,local_78,&local_160,0x41);
    local_270[0] = iVar2 != 0;
    local_268._M_p = (pointer)0x0;
    if (iVar2 == 0) {
      testing::Message::Message((Message *)local_2f8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_1e8,(internal *)local_270,
                 (AssertionResult *)
                 "EVP_HPKE_KEY_public_key(key.get(), public_key, &public_key_len, sizeof(public_key))"
                 ,"false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_158,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x7d4,(char *)CONCAT44(local_1e8._4_4_,local_1e8._0_4_));
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_158,(Message *)local_2f8);
      goto LAB_001642d5;
    }
    local_1e8._0_2_ = 0xfe0d;
    local_1e8._2_2_ = 1;
    local_1d0._M_allocated_capacity._0_7_ = 0x656c706d617865;
    local_1d0._7_4_ = 0x6d6f632e;
    local_1e8._16_8_ = 0xb;
    local_1d0._M_local_buf[0xb] = '\0';
    local_1c0 = (EVP_HPKE_KEY *)0x0;
    local_1b8 = 0;
    local_1b0 = (pointer)0x0;
    puStack_1a8 = (pointer)0x0;
    local_1a0 = (pointer)0x0;
    local_198 = 0x10;
    local_270._0_2_ = 1;
    local_270._2_2_ = 1;
    __l._M_len = 2;
    __l._M_array = (iterator)local_270;
    local_1e8._8_8_ = &local_1d0;
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
              (&local_190,__l,(allocator_type *)local_2f8);
    local_178 = (pointer)0x0;
    puStack_170 = (pointer)0x0;
    local_168 = (pointer)0x0;
    local_318.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_318.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (uint8_t *)0x0;
    local_318.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1c0 = &local_e8;
    bVar1 = MakeECHConfig(&local_318,(ECHConfigParams *)local_1e8);
    local_2f8[0] = (allocator_type)bVar1;
    local_2f0._M_p = (pointer)0x0;
    if (bVar1) {
      iVar2 = SSL_ECH_KEYS_add(local_320._M_head_impl,1,
                               local_318.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start,
                               (long)local_318.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_318.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start,&local_e8);
      aVar4 = (allocator_type)(iVar2 != 0);
      local_2f0._M_p = (pointer)0x0;
      local_2f8[0] = aVar4;
      if (!(bool)aVar4) {
        testing::Message::Message((Message *)&local_158);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_270,(internal *)local_2f8,
                   (AssertionResult *)
                   "SSL_ECH_KEYS_add(keys.get(), 1, ech_config.data(), ech_config.size(), key.get())"
                   ,"false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_348,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x7dd,(char *)CONCAT44(local_270._4_4_,local_270._0_4_));
        testing::internal::AssertHelper::operator=((AssertHelper *)local_348,(Message *)&local_158);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_348);
        if ((undefined1 *)CONCAT44(local_270._4_4_,local_270._0_4_) != local_260) {
          operator_delete((undefined1 *)CONCAT44(local_270._4_4_,local_270._0_4_),
                          (long)local_260 + 1);
        }
        if (local_158.kem != (EVP_HPKE_KEM *)0x0) {
          (**(code **)(*(long *)local_158.kem + 8))();
        }
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f0._M_p !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_2f0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_2f0._M_p);
        }
      }
      EVP_HPKE_KEY_zero(&local_158);
      pEVar3 = EVP_hpke_x25519_hkdf_sha256();
      iVar2 = EVP_HPKE_KEY_generate(&local_158,pEVar3);
      local_2f8[0] = (allocator_type)(iVar2 != 0);
      local_2f0._M_p = (pointer)0x0;
      if (iVar2 == 0) {
        testing::Message::Message((Message *)local_348);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_270,(internal *)local_2f8,
                   (AssertionResult *)
                   "EVP_HPKE_KEY_generate(wrong_key.get(), EVP_hpke_x25519_hkdf_sha256())","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_358,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x7e2,(char *)CONCAT44(local_270._4_4_,local_270._0_4_));
        testing::internal::AssertHelper::operator=(&local_358,(Message *)local_348);
        testing::internal::AssertHelper::~AssertHelper(&local_358);
        if ((undefined1 *)CONCAT44(local_270._4_4_,local_270._0_4_) != local_260) {
          operator_delete((undefined1 *)CONCAT44(local_270._4_4_,local_270._0_4_),
                          (long)local_260 + 1);
        }
        if ((long *)CONCAT44(local_348._4_4_,local_348._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_348._4_4_,local_348._0_4_) + 8))();
        }
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f0._M_p !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_2f0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_2f0._M_p);
        }
      }
      else {
        iVar2 = SSL_ECH_KEYS_add(local_320._M_head_impl,1,
                                 local_318.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start,
                                 (long)local_318.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_318.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start,&local_158);
        local_2f8[0] = (allocator_type)(iVar2 == 0);
        local_2f0._M_p = (pointer)0x0;
        if (iVar2 != 0) {
          testing::Message::Message((Message *)local_348);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_270,(internal *)local_2f8,
                     (AssertionResult *)
                     "SSL_ECH_KEYS_add(keys.get(), 1, ech_config.data(), ech_config.size(), wrong_key.get())"
                     ,"true","false",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_358,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x7e5,(char *)CONCAT44(local_270._4_4_,local_270._0_4_));
          testing::internal::AssertHelper::operator=(&local_358,(Message *)local_348);
          testing::internal::AssertHelper::~AssertHelper(&local_358);
          if ((undefined1 *)CONCAT44(local_270._4_4_,local_270._0_4_) != local_260) {
            operator_delete((undefined1 *)CONCAT44(local_270._4_4_,local_270._0_4_),
                            (long)local_260 + 1);
          }
          if ((long *)CONCAT44(local_348._4_4_,local_348._0_4_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_348._4_4_,local_348._0_4_) + 8))();
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f0._M_p !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_2f0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_2f0._M_p);
          }
        }
        local_270._0_2_ = 0xfe0d;
        local_270._2_2_ = 1;
        local_258._M_dataplus._M_p._0_7_ = 0x656c706d617865;
        local_258._7_4_ = 0x6d6f632e;
        local_260 = (undefined1  [8])0xb;
        local_258._M_string_length._3_1_ = '\0';
        local_258.field_2._M_allocated_capacity = 0;
        local_258.field_2._8_2_ = 0;
        local_238 = (pointer)0x0;
        puStack_230 = (pointer)0x0;
        local_228 = (pointer)0x0;
        local_220 = 0x10;
        local_2f8._0_2_ = 1;
        local_2f8._2_2_ = 1;
        __l_00._M_len = 2;
        __l_00._M_array = (iterator)local_2f8;
        local_268._M_p = (pointer)&local_258;
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
                  (&local_218,__l_00,(allocator_type *)local_348);
        local_200 = (pointer)0x0;
        puStack_1f8 = (pointer)0x0;
        local_1f0 = (pointer)0x0;
        local_258.field_2._M_allocated_capacity = (size_type)&local_e8;
        std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_assign_aux<unsigned_char*>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_238,local_78,
                   local_e8.public_key + local_160 + 0x47);
        bVar1 = MakeECHConfig(&local_318,(ECHConfigParams *)local_270);
        local_348[0] = bVar1;
        local_340 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (bVar1) {
          iVar2 = SSL_ECH_KEYS_add(local_320._M_head_impl,1,
                                   local_318.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start,
                                   (long)local_318.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_318.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start,&local_e8);
          local_348[0] = iVar2 == 0;
          local_340 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (iVar2 != 0) {
            testing::Message::Message((Message *)&local_358);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_2f8,(internal *)local_348,
                       (AssertionResult *)
                       "SSL_ECH_KEYS_add(keys.get(), 1, ech_config.data(), ech_config.size(), key.get())"
                       ,"true","false",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_360,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x7ee,(char *)CONCAT44(local_2f8._4_4_,local_2f8._0_4_));
            testing::internal::AssertHelper::operator=(&local_360,(Message *)&local_358);
            testing::internal::AssertHelper::~AssertHelper(&local_360);
            if ((undefined1 *)CONCAT44(local_2f8._4_4_,local_2f8._0_4_) != local_2e8) {
              operator_delete((undefined1 *)CONCAT44(local_2f8._4_4_,local_2f8._0_4_),
                              (long)local_2e8 + 1);
            }
            if ((long *)CONCAT71(local_358.data_._1_7_,local_358.data_._0_1_) != (long *)0x0) {
              (**(code **)(*(long *)CONCAT71(local_358.data_._1_7_,local_358.data_._0_1_) + 8))();
            }
            if (local_340 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_340,local_340);
            }
          }
          local_2f8._0_2_ = 0xfe0d;
          local_2f8._2_2_ = 1;
          local_2e0._M_dataplus._M_p._0_7_ = 0x656c706d617865;
          local_2e0._7_4_ = 0x6d6f632e;
          local_2e8 = (undefined1  [8])0xb;
          local_2e0._M_string_length._3_1_ = '\0';
          local_2e0.field_2._M_allocated_capacity = 0;
          local_2e0.field_2._8_2_ = 0;
          local_2c0 = (pointer)0x0;
          puStack_2b8 = (pointer)0x0;
          local_2b0 = (pointer)0x0;
          local_2a8 = 0x10;
          local_348._0_4_ = 0x10001;
          __l_01._M_len = 2;
          __l_01._M_array = (iterator)local_348;
          local_2f0._M_p = (pointer)&local_2e0;
          std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
                    (&local_2a0,__l_01,(allocator_type *)&local_358);
          local_288 = (pointer)0x0;
          puStack_280 = (pointer)0x0;
          local_278 = (pointer)0x0;
          local_2e0.field_2._8_2_ = 0x10;
          local_2e0.field_2._M_allocated_capacity = (size_type)&local_e8;
          local_358.data_._0_1_ =
               (allocator_type)MakeECHConfig(&local_318,(ECHConfigParams *)local_2f8);
          local_350 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if ((bool)local_358.data_._0_1_) {
            iVar2 = SSL_ECH_KEYS_add(local_320._M_head_impl,1,
                                     local_318.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start,
                                     (long)local_318.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_318.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start,&local_e8);
            local_358.data_._0_1_ = (allocator_type)(iVar2 == 0);
            local_350 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if (!(bool)local_358.data_._0_1_) {
              testing::Message::Message((Message *)&local_360);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_348,(internal *)&local_358,
                         (AssertionResult *)
                         "SSL_ECH_KEYS_add(keys.get(), 1, ech_config.data(), ech_config.size(), key.get())"
                         ,"true","false",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        (&local_328,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0x7f8,(char *)CONCAT44(local_348._4_4_,local_348._0_4_));
              testing::internal::AssertHelper::operator=(&local_328,(Message *)&local_360);
              goto LAB_001645d0;
            }
          }
          else {
            testing::Message::Message((Message *)&local_360);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_348,(internal *)&local_358,
                       (AssertionResult *)"MakeECHConfig(&ech_config, wrong_kem)","false","true",
                       in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_328,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x7f5,(char *)CONCAT44(local_348._4_4_,local_348._0_4_));
            testing::internal::AssertHelper::operator=(&local_328,(Message *)&local_360);
LAB_001645d0:
            testing::internal::AssertHelper::~AssertHelper(&local_328);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(local_348._4_4_,local_348._0_4_) != &local_338) {
              operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)CONCAT44(local_348._4_4_,local_348._0_4_),
                              local_338._M_allocated_capacity + 1);
            }
            if (local_360.data_ != (AssertHelperData *)0x0) {
              (**(code **)(*(long *)local_360.data_ + 8))();
            }
            if (local_350 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_350,local_350);
            }
          }
          if (local_288 != (pointer)0x0) {
            operator_delete(local_288,(long)local_278 - (long)local_288);
          }
          if (local_2a0.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_2a0.
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_2a0.
                                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_2a0.
                                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          if (local_2c0 != (pointer)0x0) {
            operator_delete(local_2c0,(long)local_2b0 - (long)local_2c0);
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f0._M_p !=
              &local_2e0) {
            operator_delete(local_2f0._M_p,
                            CONCAT17(local_2e0._M_dataplus._M_p._7_1_,
                                     local_2e0._M_dataplus._M_p._0_7_) + 1);
          }
        }
        else {
          testing::Message::Message((Message *)&local_358);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_2f8,(internal *)local_348,
                     (AssertionResult *)"MakeECHConfig(&ech_config, truncated)","false","true",in_R9
                    );
          testing::internal::AssertHelper::AssertHelper
                    (&local_360,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x7eb,(char *)CONCAT44(local_2f8._4_4_,local_2f8._0_4_));
          testing::internal::AssertHelper::operator=(&local_360,(Message *)&local_358);
          testing::internal::AssertHelper::~AssertHelper(&local_360);
          if ((undefined1 *)CONCAT44(local_2f8._4_4_,local_2f8._0_4_) != local_2e8) {
            operator_delete((undefined1 *)CONCAT44(local_2f8._4_4_,local_2f8._0_4_),
                            (long)local_2e8 + 1);
          }
          if ((long *)CONCAT71(local_358.data_._1_7_,local_358.data_._0_1_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT71(local_358.data_._1_7_,local_358.data_._0_1_) + 8))();
          }
          if (local_340 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_340,local_340);
          }
        }
        if (local_200 != (pointer)0x0) {
          operator_delete(local_200,(long)local_1f0 - (long)local_200);
        }
        if (local_218.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_218.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_218.
                                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_218.
                                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_238 != (pointer)0x0) {
          operator_delete(local_238,(long)local_228 - (long)local_238);
        }
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268._M_p !=
            &local_258) {
          operator_delete(local_268._M_p,
                          CONCAT17(local_258._M_dataplus._M_p._7_1_,local_258._M_dataplus._M_p._0_7_
                                  ) + 1);
        }
      }
      EVP_HPKE_KEY_cleanup(&local_158);
    }
    else {
      testing::Message::Message((Message *)&local_158);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_270,(internal *)local_2f8,
                 (AssertionResult *)"MakeECHConfig(&ech_config, params)","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_348,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x7da,(char *)CONCAT44(local_270._4_4_,local_270._0_4_));
      testing::internal::AssertHelper::operator=((AssertHelper *)local_348,(Message *)&local_158);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_348);
      if ((undefined1 *)CONCAT44(local_270._4_4_,local_270._0_4_) != local_260) {
        operator_delete((undefined1 *)CONCAT44(local_270._4_4_,local_270._0_4_),(long)local_260 + 1)
        ;
      }
      if (local_158.kem != (EVP_HPKE_KEM *)0x0) {
        (**(code **)(*(long *)local_158.kem + 8))();
      }
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f0._M_p !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_2f0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_2f0._M_p);
      }
    }
    if (local_318.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (uint8_t *)0x0) {
      operator_delete(local_318.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_318.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_318.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_178 != (pointer)0x0) {
      operator_delete(local_178,(long)local_168 - (long)local_178);
    }
    if (local_190.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_190.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_190.
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_190.
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_1b0 != (pointer)0x0) {
      operator_delete(local_1b0,(long)local_1a0 - (long)local_1b0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._8_8_ != &local_1d0) {
      operator_delete((void *)local_1e8._8_8_,
                      CONCAT17(local_1d0._M_local_buf[7],local_1d0._M_allocated_capacity._0_7_) + 1)
      ;
    }
  }
  EVP_HPKE_KEY_cleanup(&local_e8);
LAB_001647a1:
  std::unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter> *)&local_320);
  return;
}

Assistant:

TEST(SSLTest, ECHKeyConsistency) {
  bssl::UniquePtr<SSL_ECH_KEYS> keys(SSL_ECH_KEYS_new());
  ASSERT_TRUE(keys);
  bssl::ScopedEVP_HPKE_KEY key;
  ASSERT_TRUE(EVP_HPKE_KEY_generate(key.get(), EVP_hpke_x25519_hkdf_sha256()));
  uint8_t public_key[EVP_HPKE_MAX_PUBLIC_KEY_LENGTH];
  size_t public_key_len;
  ASSERT_TRUE(EVP_HPKE_KEY_public_key(key.get(), public_key, &public_key_len,
                                      sizeof(public_key)));

  // Adding an ECHConfig with the matching public key succeeds.
  ECHConfigParams params;
  params.key = key.get();
  std::vector<uint8_t> ech_config;
  ASSERT_TRUE(MakeECHConfig(&ech_config, params));
  EXPECT_TRUE(SSL_ECH_KEYS_add(keys.get(), /*is_retry_config=*/1,
                               ech_config.data(), ech_config.size(),
                               key.get()));

  // Adding an ECHConfig with the wrong public key is an error.
  bssl::ScopedEVP_HPKE_KEY wrong_key;
  ASSERT_TRUE(
      EVP_HPKE_KEY_generate(wrong_key.get(), EVP_hpke_x25519_hkdf_sha256()));
  EXPECT_FALSE(SSL_ECH_KEYS_add(keys.get(), /*is_retry_config=*/1,
                                ech_config.data(), ech_config.size(),
                                wrong_key.get()));

  // Adding an ECHConfig with a truncated public key is an error.
  ECHConfigParams truncated;
  truncated.key = key.get();
  truncated.public_key.assign(public_key, public_key + public_key_len - 1);
  ASSERT_TRUE(MakeECHConfig(&ech_config, truncated));
  EXPECT_FALSE(SSL_ECH_KEYS_add(keys.get(), /*is_retry_config=*/1,
                                ech_config.data(), ech_config.size(),
                                key.get()));

  // Adding an ECHConfig with the right public key, but wrong KEM ID, is an
  // error.
  ECHConfigParams wrong_kem;
  wrong_kem.key = key.get();
  wrong_kem.kem_id = 0x0010;  // DHKEM(P-256, HKDF-SHA256)
  ASSERT_TRUE(MakeECHConfig(&ech_config, wrong_kem));
  EXPECT_FALSE(SSL_ECH_KEYS_add(keys.get(), /*is_retry_config=*/1,
                                ech_config.data(), ech_config.size(),
                                key.get()));
}